

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O2

bool anon_unknown.dwarf_d9f01::open_map
               (char *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *cmap,Iconv *iconv)

{
  undefined1 uVar1;
  int iVar2;
  ostream *poVar3;
  istream *piVar4;
  size_t sVar5;
  char *col [2];
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_280;
  string pos;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,filename,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"ifs");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"no such file or directory: ");
    std::operator<<(poVar3,filename);
    MeCab::die::~die((die *)&local_280);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&cmap->_M_t);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifs,(string *)&line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    sVar5 = MeCab::tokenize2<char**>(line._M_dataplus._M_p," \t",col,2);
    if (sVar5 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x19);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,
                               "2 == tokenize2(const_cast<char *>(line.c_str()), \" \\t\", col, 2)")
      ;
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"format error: ");
      std::operator<<(poVar3,(string *)&line);
      MeCab::die::~die((die *)&local_280);
    }
    std::__cxx11::string::string((string *)&pos,col[1],(allocator *)&local_280);
    if (iconv != (Iconv *)0x0) {
      MeCab::Iconv::convert(iconv,&pos);
    }
    iVar2 = atoi(col[0]);
    std::__cxx11::string::string((string *)&local_280,(string *)&pos);
    local_280.second = iVar2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)cmap,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&pos);
  }
  std::__cxx11::string::~string((string *)&line);
  uVar1 = std::ifstream::~ifstream(&ifs);
  return (bool)uVar1;
}

Assistant:

bool open_map(const char *filename,
              std::map<std::string, int> *cmap,
              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  cmap->clear();
  char *col[2];
  std::string line;
  while (std::getline(ifs, line)) {
    CHECK_DIE(2 == tokenize2(const_cast<char *>(line.c_str()),
                             " \t", col, 2))
        << "format error: " << line;
    std::string pos = col[1];
    if (iconv) {
      iconv->convert(&pos);
    }
    cmap->insert(std::pair<std::string, int>
                 (pos, std::atoi(col[0])));
  }
  return true;
}